

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:251:34)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:251:34)>
          *this,ExceptionOrValue *output)

{
  char *pcVar1;
  size_t sVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar3;
  char (*in_RCX) [9];
  ExceptionOr<kj::_::Void> depResult;
  String local_528;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_508;
  ExceptionOr<kj::Promise<void>_> local_500;
  ExceptionOrValue local_358;
  char local_1c0;
  Exception local_1b8;
  
  local_358.exception.ptr.isSet = false;
  local_1c0 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_358);
  if (local_358.exception.ptr.isSet == true) {
    local_500.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_358.exception.ptr.field_1.value.ownFile.content.ptr;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_358.exception.ptr.field_1.value.ownFile.content.size_;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_358.exception.ptr.field_1.value.ownFile.content.disposer;
    local_358.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_358.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_358.exception.ptr.field_1.value.file;
    local_500.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_358.exception.ptr.field_1._32_8_;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_358.exception.ptr.field_1.value.description.content.ptr;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_358.exception.ptr.field_1.value.description.content.size_;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_358.exception.ptr.field_1.value.description.content.disposer;
    local_358.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_358.exception.ptr.field_1.value.description.content.size_ = 0;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_358.exception.ptr.field_1.value.context.ptr.disposer;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_358.exception.ptr.field_1.value.context.ptr.ptr;
    local_358.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_358.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_358.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_358.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_358.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_358.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_500.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_358.exception.ptr.field_1 + 0x68),0x105);
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_358.exception.ptr.field_1.value.details.builder.ptr;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_358.exception.ptr.field_1.value.details.builder.pos;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_358.exception.ptr.field_1.value.details.builder.endPtr;
    local_500.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_358.exception.ptr.field_1.value.details.builder.disposer;
    local_358.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_358.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_358.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_500.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_500)
    ;
    aVar3 = local_500.value.ptr.field_1;
    if ((local_500.value.ptr.isSet == true) &&
       (local_500.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_500.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar3);
    }
  }
  else {
    if (local_1c0 != '\x01') goto LAB_001cf349;
    Debug::makeDescription<char_const(&)[9]>(&local_528,(Debug *)0x4b973b,"catch me",in_RCX);
    Exception::Exception
              (&local_1b8,FAILED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
               ,0xfc,&local_528);
    PromiseDisposer::alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_508.value,&local_1b8);
    Exception::~Exception(&local_1b8);
    sVar2 = local_528.content.size_;
    pcVar1 = local_528.content.ptr;
    if (local_528.content.ptr != (char *)0x0) {
      local_528.content.ptr = (char *)0x0;
      local_528.content.size_ = 0;
      (**(local_528.content.disposer)->_vptr_ArrayDisposer)
                (local_528.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
    local_500.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_500.value.ptr.isSet = true;
    local_500.value.ptr.field_1 = local_508;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_500)
    ;
    aVar3 = local_500.value.ptr.field_1;
    if ((local_500.value.ptr.isSet == true) &&
       (local_500.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_500.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar3);
    }
  }
  if (local_500.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_500.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_001cf349:
  if (local_358.exception.ptr.isSet == true) {
    Exception::~Exception(&local_358.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }